

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O0

void __thiscall ctemplate::IndentedWriter::DoWrite(IndentedWriter *this,string *line)

{
  bool bVar1;
  string *line_local;
  IndentedWriter *this_local;
  
  if (this->line_state_ == AT_BEGINNING) {
    IndentLine(this);
  }
  std::__cxx11::string::append((string *)this->out_);
  bVar1 = EndsWithNewline(line);
  if (bVar1) {
    this->line_state_ = AT_BEGINNING;
  }
  else {
    this->line_state_ = MID_LINE;
  }
  return;
}

Assistant:

void DoWrite(const string& line) {
    if (line_state_ == AT_BEGINNING) {
      IndentLine();
    }
    out_->append(line);
    if (EndsWithNewline(line)) {
      line_state_ = AT_BEGINNING;
    } else {
      line_state_ = MID_LINE;
    }
  }